

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int local_110;
  REF_BOOL local_10c;
  REF_BOOL local_108;
  int local_104;
  REF_BOOL local_100;
  REF_BOOL local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d4;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_list [2];
  REF_INT ncell;
  REF_INT cell;
  REF_BOOL found_too_many;
  REF_BOOL found_one;
  REF_BOOL no_edge;
  REF_BOOL no_face;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_INT geom;
  REF_INT item;
  REF_INT node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  ref_cell = (REF_CELL)ref_grid->geom;
  geom = 0;
  ref_node = (REF_NODE)ref_grid;
  do {
    if (ref_geom->max <= geom) {
      _item = (REF_CELL)ref_node->global;
      cell_list[1] = 0;
      do {
        if (_item->max <= cell_list[1]) {
          return 0;
        }
        if (((-1 < cell_list[1]) && (cell_list[1] < _item->max)) &&
           (_item->c2n[_item->size_per * cell_list[1]] != -1)) {
          uVar2 = ref_cell_list_with2(_item,_item->c2n[_item->size_per * cell_list[1]],
                                      _item->c2n[_item->size_per * cell_list[1] + 1],2,cell_list,
                                      &ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x821,"ref_geom_verify_topo",(ulong)uVar2,"edge list for edge");
            return uVar2;
          }
          if (cell_list[0] == 2) {
            printf("error: two edg found with same nodes\n");
            printf("edg %d n %d %d id %d\n",(ulong)(uint)ref_private_macro_code_rss_1,
                   (ulong)(uint)_item->c2n[_item->size_per * ref_private_macro_code_rss_1],
                   (ulong)(uint)_item->c2n[_item->size_per * ref_private_macro_code_rss_1 + 1],
                   (ulong)(uint)_item->c2n[_item->size_per * ref_private_macro_code_rss_1 + 2]);
            printf("edg %d n %d %d id %d\n",(ulong)(uint)ref_private_macro_code_rss,
                   (ulong)(uint)_item->c2n[_item->size_per * ref_private_macro_code_rss],
                   (ulong)(uint)_item->c2n[_item->size_per * ref_private_macro_code_rss + 1],
                   (ulong)(uint)_item->c2n[_item->size_per * ref_private_macro_code_rss + 2]);
            uVar2 = ref_grid_tattle((REF_GRID)ref_node,_item->c2n[_item->size_per * cell_list[1]]);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x82c,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
              return uVar2;
            }
            uVar2 = ref_grid_tattle((REF_GRID)ref_node,
                                    _item->c2n[_item->size_per * cell_list[1] + 1]);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x82d,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
              return uVar2;
            }
            uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x82e,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
              return uVar2;
            }
          }
          if ((long)cell_list[0] != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x830,"ref_geom_verify_topo","expect only one edge cell for two nodes",1,
                   (long)cell_list[0]);
            return 1;
          }
        }
        cell_list[1] = cell_list[1] + 1;
      } while( true );
    }
    if (((geom < 0) || (ref_geom->max <= geom)) || (*(long *)(ref_geom->descr + (long)geom * 2) < 0)
       ) {
      if ((geom < 0) || (*ref_cell[1].e2n <= geom)) {
        local_110 = -1;
      }
      else {
        local_110 = *(int *)(*(long *)(ref_cell[1].e2n + 2) + (long)geom * 4);
      }
      if (local_110 != -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x818,"ref_geom_verify_topo","invalid node has geom");
        return 1;
      }
    }
    else {
      uVar2 = ref_geom_is_a((REF_GEOM)ref_cell,geom,0,&geom_face);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x7b6,"ref_geom_verify_topo",(ulong)uVar2,"node");
        return uVar2;
      }
      uVar2 = ref_geom_is_a((REF_GEOM)ref_cell,geom,1,&no_face);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x7b7,"ref_geom_verify_topo",(ulong)uVar2,"edge");
        return uVar2;
      }
      uVar2 = ref_geom_is_a((REF_GEOM)ref_cell,geom,2,&no_edge);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x7b8,"ref_geom_verify_topo",(ulong)uVar2,"face");
        return uVar2;
      }
      if ((geom < 0) || (**(int **)(ref_node->part + 0x10) <= geom)) {
        local_d4 = -1;
      }
      else {
        local_d4 = *(int *)(*(long *)(*(long *)(ref_node->part + 0x10) + 8) + (long)geom * 4);
      }
      bVar3 = false;
      if (local_d4 == -1) {
        if ((geom < 0) || (**(int **)(ref_node->age + 0x10) <= geom)) {
          local_dc = -1;
        }
        else {
          local_dc = *(int *)(*(long *)(*(long *)(ref_node->age + 0x10) + 8) + (long)geom * 4);
        }
        bVar3 = false;
        if (local_dc == -1) {
          if ((geom < 0) || (*(int *)ref_node->real[8] <= geom)) {
            local_e0 = -1;
          }
          else {
            local_e0 = *(int *)(*(long *)((long)ref_node->real[8] + 8) + (long)geom * 4);
          }
          bVar3 = false;
          if (local_e0 == -1) {
            if ((geom < 0) || (**(int **)(*(long *)&ref_node->naux + 0x40) <= geom)) {
              local_e4 = -1;
            }
            else {
              local_e4 = *(int *)(*(long *)(*(long *)(*(long *)&ref_node->naux + 0x40) + 8) +
                                 (long)geom * 4);
            }
            bVar3 = local_e4 == -1;
          }
        }
      }
      if ((geom < 0) || (*(int *)ref_node->global[8] <= geom)) {
        local_e8 = -1;
      }
      else {
        local_e8 = *(int *)(*(long *)(ref_node->global[8] + 8) + (long)geom * 4);
      }
      bVar4 = false;
      if (local_e8 == -1) {
        if ((geom < 0) || (*(int *)ref_node->sorted_global[8] <= geom)) {
          local_f0 = -1;
        }
        else {
          local_f0 = *(int *)(*(long *)(ref_node->sorted_global[8] + 8) + (long)geom * 4);
        }
        bVar4 = false;
        if (local_f0 == -1) {
          if ((geom < 0) || (**(int **)(ref_node->sorted_local + 0x10) <= geom)) {
            local_f4 = -1;
          }
          else {
            local_f4 = *(int *)(*(long *)(*(long *)(ref_node->sorted_local + 0x10) + 8) +
                               (long)geom * 4);
          }
          bVar4 = local_f4 == -1;
        }
      }
      if (geom_face != 0) {
        if ((bVar4) &&
           (*(int *)((long)ref_geom->tolerance_protection + 4) ==
            *(int *)((long)ref_geom->initial_cell_height + (long)geom * 4))) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7c2,"ref_geom_verify_topo","geom node missing edge");
          return 1;
        }
        if ((bVar3) &&
           (*(int *)((long)ref_geom->tolerance_protection + 4) ==
            *(int *)((long)ref_geom->initial_cell_height + (long)geom * 4))) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7c5,"ref_geom_verify_topo","geom node missing tri or qua");
          return 1;
        }
      }
      if (no_face != 0) {
        if ((bVar4) &&
           (*(int *)((long)ref_geom->tolerance_protection + 4) ==
            *(int *)((long)ref_geom->initial_cell_height + (long)geom * 4))) {
          uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7ca,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
            return uVar2;
          }
          uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7cc,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
            return uVar2;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7cd,"ref_geom_verify_topo","geom edge missing edge");
          return 1;
        }
        if ((bVar3) &&
           (*(int *)((long)ref_geom->tolerance_protection + 4) ==
            *(int *)((long)ref_geom->initial_cell_height + (long)geom * 4))) {
          uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   2000,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
            return uVar2;
          }
          uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7d2,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
            return uVar2;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7d3,"ref_geom_verify_topo","geom edge missing tri or qua");
          return 1;
        }
      }
      if (((no_edge != 0) && (bVar3)) &&
         (*(int *)((long)ref_geom->tolerance_protection + 4) ==
          *(int *)((long)ref_geom->initial_cell_height + (long)geom * 4))) {
        printf("no face for geom\n");
        uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7d9,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
          return uVar2;
        }
        uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7db,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
          return uVar2;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x7dc,"ref_geom_verify_topo","geom face missing tri or qua");
        return 1;
      }
      if ((!bVar4) && (no_face == 0)) {
        printf("no geom for edge\n");
        uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7e2,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
          return uVar2;
        }
        uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7e4,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
          return uVar2;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x7e5,"ref_geom_verify_topo","geom edge missing for edg");
        return 1;
      }
      if (((!bVar3) && (no_edge == 0)) &&
         (lVar1._0_4_ = ref_cell[3].type, lVar1._4_4_ = ref_cell[3].last_node_is_an_id, lVar1 == 0))
      {
        printf("no geom for face\n");
        uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7eb,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
          return uVar2;
        }
        uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x7ed,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
          return uVar2;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x7ee,"ref_geom_verify_topo","geom face missing tri or qua");
        return 1;
      }
      if ((no_face != 0) && (geom_face == 0)) {
        bVar3 = false;
        bVar4 = false;
        if ((geom < 0) || (*ref_cell[1].e2n <= geom)) {
          local_f8 = -1;
        }
        else {
          local_f8 = *(int *)(*(long *)(ref_cell[1].e2n + 2) + (long)geom * 4);
        }
        geom_node = local_f8;
        if (local_f8 == -1) {
          local_fc = -1;
        }
        else {
          local_fc = *(REF_BOOL *)(*(long *)(ref_cell[1].e2n + 4) + 4 + (long)local_f8 * 8);
        }
        geom_edge = local_fc;
        while (geom_node != -1) {
          if (*(int *)(*(long *)&ref_cell->edge_per + (long)(geom_edge * 6) * 4) == 1) {
            if (bVar3) {
              bVar4 = true;
            }
            bVar3 = true;
          }
          geom_node = *(int *)(*(long *)(ref_cell[1].e2n + 4) + (long)geom_node * 8);
          if (geom_node == -1) {
            local_100 = -1;
          }
          else {
            local_100 = *(REF_BOOL *)(*(long *)(ref_cell[1].e2n + 4) + 4 + (long)geom_node * 8);
          }
          geom_edge = local_100;
        }
        if ((!bVar3) || (bVar4)) {
          if (!bVar3) {
            printf("none found\n");
          }
          if (bVar4) {
            printf("found too many\n");
          }
          uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7fd,"ref_geom_verify_topo",(ulong)uVar2,"tatt");
            return uVar2;
          }
          uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7ff,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
            return uVar2;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x800,"ref_geom_verify_topo","multiple geom edge away from geom node");
          return 1;
        }
      }
      if ((no_edge != 0) && (no_face == 0)) {
        bVar3 = false;
        bVar4 = false;
        if ((geom < 0) || (*ref_cell[1].e2n <= geom)) {
          local_104 = -1;
        }
        else {
          local_104 = *(int *)(*(long *)(ref_cell[1].e2n + 2) + (long)geom * 4);
        }
        geom_node = local_104;
        if (local_104 == -1) {
          local_108 = -1;
        }
        else {
          local_108 = *(REF_BOOL *)(*(long *)(ref_cell[1].e2n + 4) + 4 + (long)local_104 * 8);
        }
        geom_edge = local_108;
        while (geom_node != -1) {
          if (*(int *)(*(long *)&ref_cell->edge_per + (long)(geom_edge * 6) * 4) == 2) {
            if (bVar3) {
              bVar4 = true;
            }
            bVar3 = true;
          }
          geom_node = *(int *)(*(long *)(ref_cell[1].e2n + 4) + (long)geom_node * 8);
          if (geom_node == -1) {
            local_10c = -1;
          }
          else {
            local_10c = *(REF_BOOL *)(*(long *)(ref_cell[1].e2n + 4) + 4 + (long)geom_node * 8);
          }
          geom_edge = local_10c;
        }
        if ((!bVar3) || (bVar4)) {
          if (!bVar3) {
            printf("none found\n");
          }
          if (bVar4) {
            printf("found too many\n");
          }
          uVar2 = ref_grid_tattle((REF_GRID)ref_node,geom);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x810,"ref_geom_verify_topo",(ulong)uVar2,"tattle");
            return uVar2;
          }
          uVar2 = ref_geom_tec_para_shard((REF_GRID)ref_node,"ref_geom_topo_error");
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x812,"ref_geom_verify_topo",(ulong)uVar2,"geom tec");
            return uVar2;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x813,"ref_geom_verify_topo","multiple geom face away from geom edge");
          return 1;
        }
      }
    }
    geom = geom + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, geom;
  REF_BOOL geom_node, geom_edge, geom_face;
  REF_BOOL no_face, no_edge;
  REF_BOOL found_one;
  REF_BOOL found_too_many;
  REF_INT cell, ncell, cell_list[2];

  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (ref_node_valid(ref_node, node)) {
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face");
      no_face = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr3(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_qua(ref_grid), node);
      no_edge = ref_cell_node_empty(ref_grid_edg(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed3(ref_grid), node);
      if (geom_node) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          THROW("geom node missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          THROW("geom node missing tri or qua");
        }
      }
      if (geom_edge) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing tri or qua");
        }
      }
      if (geom_face) {
        if (no_face && ref_node_owned(ref_node, node)) {
          printf("no face for geom\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (!no_edge) {
        if (!geom_edge) {
          printf("no geom for edge\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing for edg");
        }
      }
      if (!no_face) {
        if (!geom_face && !ref_geom_meshlinked(ref_geom)) {
          printf("no geom for face\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (geom_edge && !geom_node) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_geom_having_node(ref_geom, node, item, geom) {
          if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tatt");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom edge away from geom node");
        }
      }
      if (geom_face && !geom_edge) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item,
                                        geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom face away from geom edge");
        }
      }
    } else {
      if (!ref_adj_empty(ref_geom_adj(ref_geom), node))
        THROW("invalid node has geom");
    }
  }

  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_list_with2(ref_cell, ref_cell_c2n(ref_cell, 0, cell),
                            ref_cell_c2n(ref_cell, 1, cell), 2, &ncell,
                            cell_list),
        "edge list for edge");
    if (2 == ncell) {
      printf("error: two edg found with same nodes\n");
      printf("edg %d n %d %d id %d\n", cell_list[0],
             ref_cell_c2n(ref_cell, 0, cell_list[0]),
             ref_cell_c2n(ref_cell, 1, cell_list[0]),
             ref_cell_c2n(ref_cell, 2, cell_list[0]));
      printf("edg %d n %d %d id %d\n", cell_list[1],
             ref_cell_c2n(ref_cell, 0, cell_list[1]),
             ref_cell_c2n(ref_cell, 1, cell_list[1]),
             ref_cell_c2n(ref_cell, 2, cell_list[1]));
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 0, cell)), "tattle");
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 1, cell)), "tattle");
      RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"), "geom tec");
    }
    REIS(1, ncell, "expect only one edge cell for two nodes");
  }

  return REF_SUCCESS;
}